

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall LiteralsTest_Format_Test::TestBody(LiteralsTest_Format_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<wchar_t> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_00;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> udl_format_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> udl_format;
  AssertHelper local_8a8 [2];
  undefined8 local_898;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_888;
  internal local_868 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_860;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_818;
  undefined1 *local_810;
  long local_808;
  undefined8 local_800;
  undefined1 local_7f8 [2000];
  
  local_818.ptr_._0_4_ = 1;
  fmt::v5::internal::udl_formatter<char,(char)123,(char)125,(char)99,(char)123,(char)125>::
  operator()(&local_838,local_8a8,(char (*) [3])0x235c94,(int *)&local_818);
  local_8a8[0].data_ = (AssertHelperData *)0x235c94;
  local_898 = 1;
  local_808 = 0;
  local_818.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_800 = 500;
  format_str.size_ = 5;
  format_str.data_ = "{}c{}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_8a8;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[3],int>
                ::TYPES;
  local_810 = local_7f8;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_818,format_str,args,(locale_ref)0x0);
  paVar1 = &local_858.field_2;
  local_858._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_858,local_810,local_810 + local_808);
  local_818.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_810 != local_7f8) {
    operator_delete(local_810);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_888,"format(\"{}c{}\", \"ab\", 1)","udl_format",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_858,
             &local_838);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_858._M_dataplus._M_p != paVar1) {
    operator_delete(local_858._M_dataplus._M_p);
  }
  if ((char)local_888._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_888._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_888._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_8a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x75c,pcVar3);
    testing::internal::AssertHelper::operator=(local_8a8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper(local_8a8);
    if (local_818.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_818.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_818.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_888._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_818.ptr_._0_4_ = 1;
  fmt::v5::internal::
  udl_formatter<wchar_t,(wchar_t)123,(wchar_t)125,(wchar_t)99,(wchar_t)123,(wchar_t)125>::operator()
            (&local_858,local_8a8,(wchar_t (*) [3])L"ab",(int *)&local_818);
  local_8a8[0].data_ = (AssertHelperData *)0x245b6c;
  local_898 = 1;
  local_808 = 0;
  local_818.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  local_800 = 500;
  format_str_00.size_ = 5;
  format_str_00.data_ = L"{}c{}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_8a8;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,wchar_t[3],int>
       ::TYPES;
  local_810 = local_7f8;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_818,format_str_00,args_00,(locale_ref)0x0);
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_888,local_810,local_810 + local_808 * 4);
  local_818.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  if (local_810 != local_7f8) {
    operator_delete(local_810);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            (local_868,"format(L\"{}c{}\", L\"ab\", 1)","udl_format_w",&local_888,&local_858);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p);
  }
  if (local_868[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_818);
    if (local_860.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_860.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_8a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x75e,pcVar3);
    testing::internal::AssertHelper::operator=(local_8a8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper(local_8a8);
    if (local_818.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_818.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_818.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_860,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_858._M_dataplus._M_p != paVar1) {
    operator_delete(local_858._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(LiteralsTest, Format) {
  auto udl_format = "{}c{}"_format("ab", 1);
  EXPECT_EQ(format("{}c{}", "ab", 1), udl_format);
  auto udl_format_w = L"{}c{}"_format(L"ab", 1);
  EXPECT_EQ(format(L"{}c{}", L"ab", 1), udl_format_w);
}